

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

ArrayLen * __thiscall MixedArena::alloc<wasm::ArrayLen>(MixedArena *this)

{
  ArrayLen *this_00;
  ArrayLen *ret;
  MixedArena *this_local;
  
  this_00 = (ArrayLen *)allocSpace(this,0x18,8);
  ::wasm::ArrayLen::ArrayLen(this_00,this);
  return this_00;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }